

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3b2999::Handlers::beginUnderOverlay(Handlers *this,JSON *j)

{
  bool bVar1;
  undefined8 extraout_RAX;
  char *message;
  string file;
  allocator<char> local_69;
  JSON local_68;
  undefined1 local_58 [32];
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"file",&local_69);
  JSON::getDictItem(&local_68,(string *)j);
  bVar1 = JSON::getString(&local_68,(string *)(local_58 + 0x20));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_58);
  if (bVar1) {
    QPDFJob::UOConfig::file
              ((this->c_uo).super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,(string *)(local_58 + 0x20));
    std::__cxx11::string::~string((string *)(local_58 + 0x20));
    return;
  }
  message = "file is required in underlay/overlay specification";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"file is required in underlay/overlay specification",
             (allocator<char> *)&local_68);
  usage((Handlers *)local_58,(string *)message);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 0x20));
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
Handlers::beginUnderOverlay(JSON const& j)
{
    // File has to be processed before items, so handle it here.
    std::string file;
    if (!j.getDictItem("file").getString(file)) {
        QTC::TC("qpdf", "QPDFJob json over/under no file");
        usage("file is required in underlay/overlay specification");
    }
    c_uo->file(file);
}